

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_11,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_2> *pVVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  Vector<float,_2> *pVVar5;
  long lVar6;
  int col;
  bool bVar7;
  float fVar8;
  undefined4 uVar9;
  float afStack_8c [5];
  undefined8 uStack_78;
  Matrix<float,_2,_4> retVal;
  Type in1;
  Type in0;
  int local_10 [4];
  
  pVVar1 = in1.m_data.m_data + 3;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      lVar6 = 0;
      do {
        fVar8 = 1.0;
        if (lVar3 != lVar6) {
          fVar8 = 0.0;
        }
        pVVar1[lVar6].m_data[0] = fVar8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      pVVar1 = (Vector<float,_2> *)(pVVar1->m_data + 1);
      bVar7 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar7);
    in1.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[0].m_data;
  }
  else {
    in1.m_data.m_data[3].m_data[0] = 0.0;
    in1.m_data.m_data[3].m_data[1] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat4x2;
    lVar3 = 0;
    do {
      lVar6 = 0;
      do {
        pVVar1[lVar6].m_data[0] = (float)puVar4[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      pVVar1 = (Vector<float,_2> *)(pVVar1->m_data + 1);
      puVar4 = puVar4 + 4;
      bVar7 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar7);
  }
  pVVar1 = retVal.m_data.m_data + 3;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      lVar6 = 0;
      do {
        fVar8 = 1.0;
        if (lVar3 != lVar6) {
          fVar8 = 0.0;
        }
        pVVar1[lVar6].m_data[0] = fVar8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      pVVar1 = (Vector<float,_2> *)(pVVar1->m_data + 1);
      bVar7 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar7);
    retVal.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in1.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    in1.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    in1.m_data.m_data[2].m_data[0] = 0.0;
    in1.m_data.m_data[2].m_data[1] = 0.0;
    retVal.m_data.m_data[3].m_data[0] = 0.0;
    retVal.m_data.m_data[3].m_data[1] = 0.0;
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    puVar4 = &DAT_00b4c400;
    lVar3 = 0;
    do {
      lVar6 = 0;
      do {
        pVVar1[lVar6].m_data[0] = (float)puVar4[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      pVVar1 = (Vector<float,_2> *)(pVVar1->m_data + 1);
      puVar4 = puVar4 + 4;
      bVar7 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar7);
  }
  puVar2 = &uStack_78;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  uStack_78 = 0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar9 = 0;
      }
      *(undefined4 *)(puVar2 + lVar6) = uVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  puVar2 = &uStack_78;
  pVVar1 = retVal.m_data.m_data + 3;
  pVVar5 = in1.m_data.m_data + 3;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)(puVar2 + lVar6) = pVVar5[lVar6].m_data[0] * pVVar1[lVar6].m_data[0];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    pVVar1 = (Vector<float,_2> *)(pVVar1->m_data + 1);
    pVVar5 = (Vector<float,_2> *)(pVVar5->m_data + 1);
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  afStack_8c[2] = (float)uStack_78 + uStack_78._4_4_ + retVal.m_data.m_data[2].m_data[0];
  afStack_8c[3] =
       retVal.m_data.m_data[0].m_data[0] + retVal.m_data.m_data[0].m_data[1] +
       retVal.m_data.m_data[2].m_data[1];
  afStack_8c[4] = retVal.m_data.m_data[1].m_data[0] + retVal.m_data.m_data[1].m_data[1];
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_10[lVar3 + -2]] = afStack_8c[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}